

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v5.cpp
# Opt level: O0

error_handler_result __thiscall
stmt_tag::
on_error<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::spirit::x3::expectation_failure<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>,boost::spirit::x3::context<error_counter_tag,std::reference_wrapper<error_counter<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,boost::spirit::x3::context<boost::spirit::x3::skipper_tag,boost::spirit::x3::char_class<boost::spirit::char_encoding::ascii,boost::spirit::x3::space_tag>const,boost::spirit::x3::unused_type>>>
          (stmt_tag *this,
          __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *first,__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *last,
          expectation_failure<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *x,context<error_counter_tag,_std::reference_wrapper<error_counter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_boost::spirit::x3::context<boost::spirit::x3::skipper_tag,_const_boost::spirit::x3::char_class<boost::spirit::char_encoding::ascii,_boost::spirit::x3::space_tag>,_boost::spirit::x3::unused_type>_>
             *context)

{
  reference_wrapper<error_counter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_00;
  error_counter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_01;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *p_Var1;
  error_counter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *counter;
  context<error_counter_tag,_std::reference_wrapper<error_counter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_boost::spirit::x3::context<boost::spirit::x3::skipper_tag,_const_boost::spirit::x3::char_class<boost::spirit::char_encoding::ascii,_boost::spirit::x3::space_tag>,_boost::spirit::x3::unused_type>_>
  *pcStack_30;
  error_reporter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::x3::expectation_failure<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_boost::spirit::x3::context<error_counter_tag,_std::reference_wrapper<error_counter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_boost::spirit::x3::context<boost::spirit::x3::skipper_tag,_const_boost::spirit::x3::char_class<boost::spirit::char_encoding::ascii,_boost::spirit::x3::space_tag>,_boost::spirit::x3::unused_type>_>_>
  er;
  context<error_counter_tag,_std::reference_wrapper<error_counter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_boost::spirit::x3::context<boost::spirit::x3::skipper_tag,_const_boost::spirit::x3::char_class<boost::spirit::char_encoding::ascii,_boost::spirit::x3::space_tag>,_boost::spirit::x3::unused_type>_>
  *context_local;
  expectation_failure<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *x_local;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *last_local;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *first_local;
  stmt_tag *this_local;
  
  pcStack_30 = context;
  error_reporter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::x3::expectation_failure<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_boost::spirit::x3::context<error_counter_tag,_std::reference_wrapper<error_counter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_boost::spirit::x3::context<boost::spirit::x3::skipper_tag,_const_boost::spirit::x3::char_class<boost::spirit::char_encoding::ascii,_boost::spirit::x3::space_tag>,_boost::spirit::x3::unused_type>_>_>
  ::operator()((error_reporter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::x3::expectation_failure<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_boost::spirit::x3::context<error_counter_tag,_std::reference_wrapper<error_counter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_boost::spirit::x3::context<boost::spirit::x3::skipper_tag,_const_boost::spirit::x3::char_class<boost::spirit::char_encoding::ascii,_boost::spirit::x3::space_tag>,_boost::spirit::x3::unused_type>_>_>
                *)((long)&counter + 7),first,last,x,context);
  this_00 = boost::spirit::x3::
            get<error_counter_tag,boost::spirit::x3::context<error_counter_tag,std::reference_wrapper<error_counter<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,boost::spirit::x3::context<boost::spirit::x3::skipper_tag,boost::spirit::x3::char_class<boost::spirit::char_encoding::ascii,boost::spirit::x3::space_tag>const,boost::spirit::x3::unused_type>>>
                      (pcStack_30);
  this_01 = std::
            reference_wrapper<error_counter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::get(this_00);
  error_counter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator()(this_01,first,last);
  p_Var1 = boost::spirit::x3::
           expectation_failure<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::where(x);
  first->_M_current = p_Var1->_M_current;
  return accept;
}

Assistant:

x3::error_handler_result on_error(
      Iterator& first, Iterator const& last, Exception const& x,
      Context const& context)
   {
      error_reporter<Iterator, Exception, Context> er;

      er(first, last, x ,context);

      auto& counter = x3::get<error_counter_tag>(context).get();

      counter(first, last);

      first = x.where();
      return x3::error_handler_result::accept;
    }